

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresdata.cpp
# Opt level: O3

void res_read_63(ResourceData *pResData,UDataInfo *pInfo,void *inBytes,int32_t length,
                UErrorCode *errorCode)

{
  UBool UVar1;
  UVersionInfo formatVersion;
  uint8_t local_24 [4];
  
  pResData->poolStringIndexLimit = 0;
  pResData->poolStringIndex16Limit = 0;
  pResData->noFallback = '\0';
  pResData->isPoolBundle = '\0';
  pResData->usesPoolBundle = '\0';
  pResData->useNativeStrcmp = '\0';
  *(undefined4 *)&pResData->field_0x3c = 0;
  pResData->rootRes = 0;
  pResData->localKeyLimit = 0;
  pResData->poolBundleStrings = (uint16_t *)0x0;
  pResData->p16BitUnits = (uint16_t *)0x0;
  pResData->poolBundleKeys = (char *)0x0;
  pResData->data = (UDataMemory *)0x0;
  pResData->pRoot = (int32_t *)0x0;
  if (U_ZERO_ERROR < *errorCode) {
    return;
  }
  UVar1 = isAcceptable(local_24,(char *)pInfo,(char *)inBytes,pInfo);
  if (UVar1 == '\0') {
    *errorCode = U_INVALID_FORMAT_ERROR;
  }
  else {
    res_init(pResData,local_24,inBytes,length,errorCode);
  }
  return;
}

Assistant:

U_CAPI void U_EXPORT2
res_read(ResourceData *pResData,
         const UDataInfo *pInfo, const void *inBytes, int32_t length,
         UErrorCode *errorCode) {
    UVersionInfo formatVersion;

    uprv_memset(pResData, 0, sizeof(ResourceData));
    if(U_FAILURE(*errorCode)) {
        return;
    }
    if(!isAcceptable(formatVersion, NULL, NULL, pInfo)) {
        *errorCode=U_INVALID_FORMAT_ERROR;
        return;
    }
    res_init(pResData, formatVersion, inBytes, length, errorCode);
}